

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicswidget.cpp
# Opt level: O0

void __thiscall
QGraphicsWidget::getWindowFrameMargins
          (QGraphicsWidget *this,qreal *left,qreal *top,qreal *right,qreal *bottom)

{
  QGraphicsWidgetPrivate *this_00;
  pointer pQVar1;
  qreal *in_RCX;
  qreal *in_RDX;
  qreal *in_RSI;
  qreal *in_R8;
  qreal qVar2;
  QGraphicsWidgetPrivate *d;
  
  this_00 = d_func((QGraphicsWidget *)0xa4bc0b);
  if ((((in_RSI != (qreal *)0x0) || (in_RDX != (qreal *)0x0)) || (in_RCX != (qreal *)0x0)) ||
     (in_R8 != (qreal *)0x0)) {
    QGraphicsWidgetPrivate::ensureWindowFrameMargins(this_00);
  }
  if (in_RSI != (qreal *)0x0) {
    pQVar1 = std::unique_ptr<QMarginsF,_std::default_delete<QMarginsF>_>::operator->
                       ((unique_ptr<QMarginsF,_std::default_delete<QMarginsF>_> *)0xa4bc53);
    qVar2 = QMarginsF::left(pQVar1);
    *in_RSI = qVar2;
  }
  if (in_RDX != (qreal *)0x0) {
    pQVar1 = std::unique_ptr<QMarginsF,_std::default_delete<QMarginsF>_>::operator->
                       ((unique_ptr<QMarginsF,_std::default_delete<QMarginsF>_> *)0xa4bc7d);
    qVar2 = QMarginsF::top(pQVar1);
    *in_RDX = qVar2;
  }
  if (in_RCX != (qreal *)0x0) {
    pQVar1 = std::unique_ptr<QMarginsF,_std::default_delete<QMarginsF>_>::operator->
                       ((unique_ptr<QMarginsF,_std::default_delete<QMarginsF>_> *)0xa4bca7);
    qVar2 = QMarginsF::right(pQVar1);
    *in_RCX = qVar2;
  }
  if (in_R8 != (qreal *)0x0) {
    pQVar1 = std::unique_ptr<QMarginsF,_std::default_delete<QMarginsF>_>::operator->
                       ((unique_ptr<QMarginsF,_std::default_delete<QMarginsF>_> *)0xa4bcd1);
    qVar2 = QMarginsF::bottom(pQVar1);
    *in_R8 = qVar2;
  }
  return;
}

Assistant:

void QGraphicsWidget::getWindowFrameMargins(qreal *left, qreal *top, qreal *right, qreal *bottom) const
{
    Q_D(const QGraphicsWidget);
    if (left || top || right || bottom)
        d->ensureWindowFrameMargins();
    if (left)
        *left = d->windowFrameMargins->left();
    if (top)
        *top = d->windowFrameMargins->top();
    if (right)
        *right = d->windowFrameMargins->right();
    if (bottom)
        *bottom = d->windowFrameMargins->bottom();
}